

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O0

string * __thiscall
GMAA_MAAstarCluster::SoftPrintClusteringStats_abi_cxx11_(GMAA_MAAstarCluster *this)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong uVar6;
  size_t sVar7;
  long *in_RSI;
  string *in_RDI;
  double dVar8;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined1 auVar12 [16];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  Index aI;
  LIndex originalBGsize;
  double average;
  uint i;
  stringstream ss;
  ostream *in_stack_fffffffffffffd68;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffd70;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd78;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd80;
  string local_1f0 [36];
  uint local_1cc;
  LIndex local_1c8;
  int *local_1c0;
  int *local_1b8;
  double local_1b0;
  uint local_1a8;
  stringstream local_198 [16];
  ostream local_188 [224];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff58;
  undefined1 auVar10 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"Number of joint types after clustering in each BG.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_188,
                           "timestep compressionRatio averageAfterClustering sizeWithoutClustering <all entries>"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  auVar13._8_56_ = extraout_var_01;
  auVar13._0_8_ = extraout_XMM1_Qa;
  local_1a8 = 0;
  while( true ) {
    uVar3 = (ulong)local_1a8;
    sVar4 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RSI + 0x89));
    if (uVar3 == sVar4) break;
    pvVar5 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RSI + 0x89),(ulong)local_1a8);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
    auVar12 = auVar13._0_16_;
    if (sVar4 != 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RSI + 0x89),(ulong)local_1a8);
      local_1b8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd68);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RSI + 0x89),(ulong)local_1a8);
      local_1c0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd68);
      dVar8 = std::
              accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,double>
                        (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         (double)in_stack_fffffffffffffd70);
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RSI + 0x89),(ulong)local_1a8);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
      auVar12 = vcvtusi2sd_avx512f(auVar12,sVar4);
      local_1b0 = dVar8 / auVar12._0_8_;
      local_1c8 = 1;
      local_1cc = 0;
      while( true ) {
        uVar3 = (ulong)local_1cc;
        uVar6 = (**(code **)(*in_RSI + 0x30))();
        auVar14._8_56_ = extraout_var_02;
        auVar14._0_8_ = extraout_XMM1_Qa_00;
        auVar9 = auVar14._0_16_;
        auVar10._8_56_ = extraout_var;
        auVar10._0_8_ = extraout_XMM0_Qa;
        auVar12 = auVar10._0_16_;
        if (uVar3 == uVar6) break;
        sVar7 = PlanningUnitMADPDiscrete::GetNrObservations
                          (in_stack_fffffffffffffd70,
                           (Index)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        auVar1 = vcvtusi2sd_avx512f(auVar12,sVar7);
        auVar12 = vcvtusi2sd_avx512f(auVar9,local_1a8);
        auVar11._0_8_ = pow(auVar1._0_8_,auVar12._0_8_);
        auVar11._8_56_ = extraout_var_00;
        auVar12 = vcvtusi2sd_avx512f(auVar11._0_16_,local_1c8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar12._0_8_ * auVar11._0_8_;
        local_1c8 = vcvttsd2usi_avx512f(auVar9);
        local_1cc = local_1cc + 1;
      }
      poVar2 = (ostream *)std::ostream::operator<<(local_188,local_1a8);
      poVar2 = std::operator<<(poVar2," ");
      dVar8 = Globals::CastLIndexToDouble(local_1c8);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar8 / local_1b0);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1b0);
      in_stack_fffffffffffffd80._M_current = (int *)std::operator<<(poVar2," ");
      in_stack_fffffffffffffd78._M_current =
           (int *)std::ostream::operator<<(in_stack_fffffffffffffd80._M_current,local_1c8);
      in_stack_fffffffffffffd70 =
           (PlanningUnitMADPDiscrete *)
           std::operator<<((ostream *)in_stack_fffffffffffffd78._M_current," ");
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RSI + 0x89),(ulong)local_1a8);
      PrintTools::SoftPrintVector<int>(in_stack_ffffffffffffff58);
      in_stack_fffffffffffffd68 = std::operator<<((ostream *)in_stack_fffffffffffffd70,local_1f0);
      std::ostream::operator<<(in_stack_fffffffffffffd68,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1f0);
      auVar13._8_56_ = extraout_var_03;
      auVar13._0_8_ = extraout_XMM1_Qa_01;
    }
    local_1a8 = local_1a8 + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string GMAA_MAAstarCluster::SoftPrintClusteringStats() const
{
    stringstream ss;

    ss << "Number of joint types after clustering in each BG." << endl;
    ss << "timestep compressionRatio averageAfterClustering sizeWithoutClustering <all entries>" << endl;

#if 0
    ss << "CBGsize";
    for(unsigned int i=0;i!=_m_clusteredBGsizes.size();++i)
    {
        double average=accumulate(_m_clusteredBGsizes[i].begin(),
                                  _m_clusteredBGsizes[i].end(),0.0) /
            _m_clusteredBGsizes[i].size();
        if(_m_clusteredBGsizes[i].size()>0)
            ss << " " << average;
    }
    ss << endl;

    ss << "CBGratio";
#endif

    for(unsigned int i=0;i!=_m_clusteredBGsizes.size();++i)
    {
        if(_m_clusteredBGsizes[i].size()>0)
        {
            double average=accumulate(_m_clusteredBGsizes[i].begin(),
                                      _m_clusteredBGsizes[i].end(),0.0) /
                _m_clusteredBGsizes[i].size();

            LIndex originalBGsize=1;
            for(Index aI=0;aI!=GetNrAgents();++aI)
                originalBGsize*=pow(//pow needs correct arguments, otherwise I get 
                    //call of overloaded 'pow(size_t, unsigned int&)' is ambiguous
                    ((double)GetNrObservations(aI)),
                    ((double)i));
            
#if 1
            ss << i
               << " " << CastLIndexToDouble(originalBGsize)/average
               << " " << average
               << " " << originalBGsize
               << " " << SoftPrintVector(_m_clusteredBGsizes[i]) << endl;
#else
            ss << " " << static_cast<double>(originalBGsize)/average;
#endif
        }
    }
    return(ss.str());
}